

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O2

directory * __thiscall
dlib::directory::get_parent(directory *__return_storage_ptr__,directory *this)

{
  long lVar1;
  string *psVar2;
  string asStack_38 [32];
  
  if ((this->state).name._M_string_length == 0) {
    data::data(&__return_storage_ptr__->state,&this->state);
  }
  else {
    (__return_storage_ptr__->state).name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->state).name.field_2;
    (__return_storage_ptr__->state).name._M_string_length = 0;
    (__return_storage_ptr__->state).name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->state).full_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->state).full_name.field_2;
    (__return_storage_ptr__->state).full_name._M_string_length = 0;
    (__return_storage_ptr__->state).full_name.field_2._M_local_buf[0] = '\0';
    psVar2 = &(this->state).full_name;
    std::__cxx11::string::rfind((char)psVar2,0x2f);
    std::__cxx11::string::substr((ulong)asStack_38,(ulong)psVar2);
    psVar2 = &(__return_storage_ptr__->state).full_name;
    std::__cxx11::string::operator=((string *)psVar2,asStack_38);
    std::__cxx11::string::~string(asStack_38);
    if ((((__return_storage_ptr__->state).full_name._M_string_length != 1) ||
        (*(psVar2->_M_dataplus)._M_p != '/')) &&
       (lVar1 = std::__cxx11::string::rfind((char)psVar2,0x2f), lVar1 != -1)) {
      std::__cxx11::string::substr((ulong)asStack_38,(ulong)psVar2);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_38);
      std::__cxx11::string::~string(asStack_38);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::push_back((char)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

const directory directory::
    get_parent (
    ) const
    {
        using namespace std;
        // if *this is the root then just return *this
        if (is_root())
        {
            return *this;
        }
        else
        {
            directory temp;

            const char sep = get_separator();

            string::size_type pos = state.full_name.find_last_of(sep);
            temp.state.full_name = state.full_name.substr(0,pos);

            if ( is_root_path(temp.state.full_name))
            {
                temp.state.full_name += sep;
            }
            else
            {
                pos = temp.state.full_name.find_last_of(sep);
                if (pos != string::npos)
                {
                    temp.state.name = temp.state.full_name.substr(pos+1);
                }
                else
                {
                    temp.state.full_name += sep;
                }
            }
            return temp;
        }
    }